

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  undefined1 uVar1;
  Vector *col;
  unsigned_long *puVar2;
  double *result;
  idx_t i;
  Allocator *pAVar3;
  long lVar4;
  idx_t iVar5;
  primitive_dictionary_entry_t *ppVar6;
  InternalException *this_00;
  uint *result_00;
  ValidityMask *chunk_end_00;
  hugeint_t *value;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Vector *mask;
  WriteStream *ser;
  idx_t r;
  idx_t iVar8;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  double target_value;
  string local_58;
  StandardColumnWriter<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *local_38;
  
  mask = input_column;
  ser = (WriteStream *)chunk_start;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_010dafd5_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  col = (Vector *)input_column->data;
  chunk_end_00 = &input_column->validity;
  result_00 = &switchD_010dafd5::switchdataD_013a3170;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator,true>
                (col,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)temp_writer,
                 (ValidityMask *)mask,ser);
      return;
    }
    TemplatedWritePlain<duckdb::hugeint_t,double,duckdb::ParquetHugeintOperator,false>
              (col,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)chunk_end_00,
               (ValidityMask *)temp_writer,ser);
    return;
  default:
    goto switchD_010dafd5_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      result_00 = (uint *)(chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = chunk_start;
      do {
        iVar5 = chunk_start;
        if (((double *)result_00 == (double *)0x0) ||
           (iVar5 = iVar8,
           ((ulong)*(double *)((long)result_00 + (iVar8 >> 6) * 8) >> (iVar8 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input_02.upper = (int64_t)&local_58;
          input_02.lower = *(uint64_t *)(&(col->type).id_ + iVar5 * 0x10);
          Hugeint::TryCast<double>
                    (*(Hugeint **)(&col->vector_type + iVar5 * 0x10),input_02,(double *)result_00);
          DbpEncoder::BeginWrite<double>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(double *)&local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar5 + 1;
          goto LAB_010db3c9;
        }
        iVar8 = iVar8 + 1;
      } while (chunk_end != iVar8);
    }
    else {
LAB_010db3c9:
      if (chunk_start < chunk_end) {
        p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (&(col->type).id_ + chunk_start * 0x10);
        do {
          puVar2 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             (result_00 = (uint *)(chunk_start >> 6),
             (puVar2[(long)result_00] >> (chunk_start & 0x3f) & 1) != 0)) {
            local_58._M_dataplus._M_p = (pointer)0x0;
            input_03.upper = (int64_t)&local_58;
            input_03.lower = (uint64_t)p_Var7->_M_pi;
            Hugeint::TryCast<double>
                      ((Hugeint *)
                       ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                       (p_Var7 + -1))->_M_ptr,input_03,(double *)result_00);
            DbpEncoder::WriteValue<double>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,(double *)&local_58);
          }
          chunk_start = chunk_start + 1;
          p_Var7 = p_Var7 + 2;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      result = (double *)(chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((result == (double *)0x0) ||
           (iVar5 = iVar8, ((ulong)result[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input_00.upper = (int64_t)&local_58;
          input_00.lower = *(uint64_t *)(&(col->type).id_ + iVar5 * 0x10);
          local_38 = this;
          Hugeint::TryCast<double>(*(Hugeint **)(&col->vector_type + iVar5 * 0x10),input_00,result);
          pAVar3 = BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          result_00 = (uint *)&local_58;
          DlbaEncoder::BeginWrite<double>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar3,temp_writer,(double *)result_00);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar5 + 1;
          goto LAB_010db24b;
        }
        iVar8 = iVar8 + 1;
      } while (chunk_end != iVar8);
    }
    else {
LAB_010db24b:
      if (chunk_start < chunk_end) {
        p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (&(col->type).id_ + chunk_start * 0x10);
        do {
          puVar2 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             (result_00 = (uint *)(chunk_start >> 6),
             (puVar2[(long)result_00] >> (chunk_start & 0x3f) & 1) != 0)) {
            local_58._M_dataplus._M_p = (pointer)0x0;
            input_01.upper = (int64_t)&local_58;
            input_01.lower = (uint64_t)p_Var7->_M_pi;
            Hugeint::TryCast<double>
                      ((Hugeint *)
                       ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                       (p_Var7 + -1))->_M_ptr,input_01,(double *)result_00);
            DlbaEncoder::WriteValue<double>
                      ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(double *)&local_58);
          }
          chunk_start = chunk_start + 1;
          p_Var7 = p_Var7 + 2;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar8 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar2 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar8 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (iVar8 = iVar5, (puVar2[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_010db309;
        }
        iVar5 = iVar5 + 1;
      } while (chunk_end != iVar5);
    }
    else {
LAB_010db309:
      if (iVar8 < chunk_end) {
        value = (hugeint_t *)(&col->vector_type + iVar8 * 0x10);
        do {
          puVar2 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0))
          {
            ppVar6 = PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>
                     ::Lookup((PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>
                               *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
            local_58._M_dataplus._M_p._0_4_ = ppVar6->index;
            RleBpEncoder::WriteValue
                      ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_58);
          }
          iVar8 = iVar8 + 1;
          value = value + 1;
        } while (chunk_end != iVar8);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar3 = BufferAllocator::Get
                         (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        puVar2 = (chunk_end_00->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (result_00 = (uint *)(chunk_start >> 6),
           (puVar2[(long)result_00] >> (chunk_start & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          input.upper = (int64_t)&local_58;
          input.lower = *(uint64_t *)(&(col->type).id_ + chunk_start * 0x10);
          Hugeint::TryCast<double>
                    (*(Hugeint **)(&col->vector_type + chunk_start * 0x10),input,(double *)result_00
                    );
          lVar4 = 0;
          do {
            uVar1 = *(undefined1 *)((long)&local_58._M_dataplus._M_p + lVar4);
            result_00 = (uint *)CONCAT71((int7)((ulong)result_00 >> 8),uVar1);
            *(undefined1 *)
             ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
             (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar4 +
                   (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) = uVar1;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}